

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O0

int Cfnan(float *val)

{
  undefined4 local_24;
  short *sptr;
  int code;
  float *val_local;
  
  if ((*(ushort *)((long)val + 2) & 0x7f80) == 0x7f80) {
    local_24 = 1;
  }
  else {
    local_24 = 0;
    if ((*(ushort *)((long)val + 2) & 0x7f80) == 0) {
      local_24 = 2;
    }
  }
  if (local_24 == 2) {
    *val = 0.0;
  }
  return (int)(local_24 != 0);
}

Assistant:

int Cfnan( float *val )
{
   int code;

#if BYTESWAPPED
   short *sptr = (short*)val + 1;
#else
   short *sptr = (short*)val;
#endif

   code = fnan(*sptr);
   if( code==2 ) *val = 0.0;   /* Underflow */

   return( code!=0 );
}